

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctfst.c
# Opt level: O1

void jpeg_idct_ifast(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                    JSAMPARRAY output_buf,JDIMENSION output_col)

{
  short sVar1;
  JSAMPLE *pJVar2;
  void *pvVar3;
  JSAMPLE JVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  JSAMPLE *pJVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  uint auStack_154 [7];
  uint auStack_138 [66];
  
  pJVar2 = cinfo->sample_range_limit;
  pvVar3 = compptr->dct_table;
  uVar10 = 9;
  lVar12 = 0;
  do {
    sVar1 = *(short *)((long)coef_block + lVar12 + 0x10);
    if ((((sVar1 == 0) && (*(short *)((long)coef_block + lVar12 + 0x20) == 0)) &&
        (*(short *)((long)coef_block + lVar12 + 0x30) == 0)) &&
       (((*(short *)((long)coef_block + lVar12 + 0x40) == 0 &&
         (*(short *)((long)coef_block + lVar12 + 0x50) == 0)) &&
        ((*(short *)((long)coef_block + lVar12 + 0x60) == 0 &&
         (*(short *)((long)coef_block + lVar12 + 0x70) == 0)))))) {
      iVar13 = (int)*(short *)((long)coef_block + lVar12) * *(int *)((long)pvVar3 + lVar12 * 2);
      *(int *)((long)auStack_154 + lVar12 * 2 + 0x1c) = iVar13;
      *(int *)((long)auStack_154 + lVar12 * 2 + 0x3c) = iVar13;
      *(int *)((long)auStack_154 + lVar12 * 2 + 0x5c) = iVar13;
      *(int *)((long)auStack_154 + lVar12 * 2 + 0x7c) = iVar13;
      *(int *)((long)auStack_154 + lVar12 * 2 + 0x9c) = iVar13;
      *(int *)((long)auStack_154 + lVar12 * 2 + 0xbc) = iVar13;
      *(int *)((long)auStack_154 + lVar12 * 2 + 0xdc) = iVar13;
      lVar7 = 0xe0;
    }
    else {
      iVar8 = (int)*(short *)((long)coef_block + lVar12) * *(int *)((long)pvVar3 + lVar12 * 2);
      iVar5 = (int)*(short *)((long)coef_block + lVar12 + 0x20) *
              *(int *)((long)pvVar3 + lVar12 * 2 + 0x40);
      iVar17 = (int)*(short *)((long)coef_block + lVar12 + 0x40) *
               *(int *)((long)pvVar3 + lVar12 * 2 + 0x80);
      iVar14 = (int)*(short *)((long)coef_block + lVar12 + 0x60) *
               *(int *)((long)pvVar3 + lVar12 * 2 + 0xc0);
      iVar13 = iVar17 + iVar8;
      iVar8 = iVar8 - iVar17;
      iVar17 = iVar14 + iVar5;
      iVar5 = (int)((ulong)((long)(iVar5 - iVar14) * 0x16a) >> 8) - iVar17;
      iVar18 = iVar13 + iVar17;
      iVar16 = (int)sVar1 * *(int *)((long)pvVar3 + lVar12 * 2 + 0x20);
      iVar13 = iVar13 - iVar17;
      iVar15 = (int)*(short *)((long)coef_block + lVar12 + 0x30) *
               *(int *)((long)pvVar3 + lVar12 * 2 + 0x60);
      iVar17 = iVar5 + iVar8;
      iVar9 = (int)*(short *)((long)coef_block + lVar12 + 0x50) *
              *(int *)((long)pvVar3 + lVar12 * 2 + 0xa0);
      iVar8 = iVar8 - iVar5;
      iVar6 = (int)*(short *)((long)coef_block + lVar12 + 0x70) *
              *(int *)((long)pvVar3 + lVar12 * 2 + 0xe0);
      iVar14 = iVar9 + iVar15;
      iVar9 = iVar9 - iVar15;
      iVar5 = iVar6 + iVar16;
      iVar16 = iVar16 - iVar6;
      iVar6 = iVar14 + iVar5;
      iVar15 = (int)((ulong)((long)(iVar16 + iVar9) * 0x1d9) >> 8);
      iVar9 = ((int)((ulong)((long)iVar9 * 0xfffffffd63) >> 8) - iVar6) + iVar15;
      iVar5 = (int)((ulong)((long)(iVar5 - iVar14) * 0x16a) >> 8) - iVar9;
      iVar14 = ((int)((ulong)((long)iVar16 * 0x115) >> 8) - iVar15) + iVar5;
      *(int *)((long)auStack_154 + lVar12 * 2 + 0x1c) = iVar6 + iVar18;
      *(int *)((long)auStack_154 + lVar12 * 2 + 0xfc) = iVar18 - iVar6;
      *(int *)((long)auStack_154 + lVar12 * 2 + 0x3c) = iVar17 + iVar9;
      *(int *)((long)auStack_154 + lVar12 * 2 + 0xdc) = iVar17 - iVar9;
      *(int *)((long)auStack_154 + lVar12 * 2 + 0x5c) = iVar8 + iVar5;
      *(int *)((long)auStack_154 + lVar12 * 2 + 0xbc) = iVar8 - iVar5;
      *(int *)((long)auStack_154 + lVar12 * 2 + 0x9c) = iVar14 + iVar13;
      iVar13 = iVar13 - iVar14;
      lVar7 = 0x60;
    }
    *(int *)((long)auStack_154 + lVar12 * 2 + lVar7 + 0x1c) = iVar13;
    uVar10 = uVar10 - 1;
    lVar12 = lVar12 + 2;
  } while (1 < uVar10);
  lVar12 = 7;
  do {
    pJVar11 = (JSAMPLE *)(*(long *)((long)output_buf + lVar12 + -7) + (ulong)output_col);
    uVar10 = auStack_154[lVar12 + 1];
    if ((((uVar10 == 0) && (auStack_154[lVar12 + 2] == 0)) &&
        ((auStack_154[lVar12 + 3] == 0 &&
         (((auStack_154[lVar12 + 4] == 0 && (auStack_154[lVar12 + 5] == 0)) &&
          (auStack_154[lVar12 + 6] == 0)))))) && (auStack_154[lVar12 + 7] == 0)) {
      JVar4 = pJVar2[(ulong)(auStack_154[lVar12] >> 5 & 0x3ff) + 0x80];
      *pJVar11 = JVar4;
      pJVar11[1] = JVar4;
      pJVar11[2] = JVar4;
      pJVar11[3] = JVar4;
      pJVar11[4] = JVar4;
      pJVar11[5] = JVar4;
      pJVar11[6] = JVar4;
      lVar7 = 7;
    }
    else {
      iVar13 = auStack_154[lVar12 + 4] + auStack_154[lVar12];
      iVar9 = auStack_154[lVar12] - auStack_154[lVar12 + 4];
      iVar17 = auStack_154[lVar12 + 6] + auStack_154[lVar12 + 2];
      iVar5 = (int)((ulong)(auStack_154[lVar12 + 2] - auStack_154[lVar12 + 6]) * 0x16a >> 8) -
              iVar17;
      iVar15 = iVar17 + iVar13;
      iVar13 = iVar13 - iVar17;
      iVar17 = iVar5 + iVar9;
      iVar9 = iVar9 - iVar5;
      iVar5 = auStack_154[lVar12 + 3] + auStack_154[lVar12 + 5];
      uVar19 = auStack_154[lVar12 + 5] - auStack_154[lVar12 + 3];
      iVar14 = auStack_154[lVar12 + 7] + uVar10;
      uVar10 = uVar10 - auStack_154[lVar12 + 7];
      iVar8 = iVar14 + iVar5;
      iVar6 = (int)((ulong)(uVar10 + uVar19) * 0x1d9 >> 8);
      iVar16 = ((int)((ulong)uVar19 * 0xfffffffd63 >> 8) - iVar8) + iVar6;
      iVar14 = (int)((ulong)(uint)(iVar14 - iVar5) * 0x16a >> 8) - iVar16;
      iVar5 = ((int)((ulong)uVar10 * 0x115 >> 8) - iVar6) + iVar14;
      *pJVar11 = pJVar2[(ulong)((uint)(iVar8 + iVar15) >> 5 & 0x3ff) + 0x80];
      pJVar11[7] = pJVar2[(ulong)((uint)(iVar15 - iVar8) >> 5 & 0x3ff) + 0x80];
      pJVar11[1] = pJVar2[(ulong)((uint)(iVar16 + iVar17) >> 5 & 0x3ff) + 0x80];
      pJVar11[6] = pJVar2[(ulong)((uint)(iVar17 - iVar16) >> 5 & 0x3ff) + 0x80];
      pJVar11[2] = pJVar2[(ulong)((uint)(iVar14 + iVar9) >> 5 & 0x3ff) + 0x80];
      pJVar11[5] = pJVar2[(ulong)((uint)(iVar9 - iVar14) >> 5 & 0x3ff) + 0x80];
      pJVar11[4] = pJVar2[(ulong)((uint)(iVar5 + iVar13) >> 5 & 0x3ff) + 0x80];
      JVar4 = pJVar2[(ulong)((uint)(iVar13 - iVar5) >> 5 & 0x3ff) + 0x80];
      lVar7 = 3;
    }
    pJVar11[lVar7] = JVar4;
    lVar12 = lVar12 + 8;
  } while (lVar12 != 0x47);
  return;
}

Assistant:

GLOBAL(void)
jpeg_idct_ifast (j_decompress_ptr cinfo, jpeg_component_info * compptr,
		 JCOEFPTR coef_block,
		 JSAMPARRAY output_buf, JDIMENSION output_col)
{
  DCTELEM tmp0, tmp1, tmp2, tmp3, tmp4, tmp5, tmp6, tmp7;
  DCTELEM tmp10, tmp11, tmp12, tmp13;
  DCTELEM z5, z10, z11, z12, z13;
  JCOEFPTR inptr;
  IFAST_MULT_TYPE * quantptr;
  int * wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[DCTSIZE2];	/* buffers data between passes */
  SHIFT_TEMPS			/* for DESCALE */
  ISHIFT_TEMPS			/* for IDESCALE */

  /* Pass 1: process columns from input, store into work array. */

  inptr = coef_block;
  quantptr = (IFAST_MULT_TYPE *) compptr->dct_table;
  wsptr = workspace;
  for (ctr = DCTSIZE; ctr > 0; ctr--) {
    /* Due to quantization, we will usually find that many of the input
     * coefficients are zero, especially the AC terms.  We can exploit this
     * by short-circuiting the IDCT calculation for any column in which all
     * the AC terms are zero.  In that case each output is equal to the
     * DC coefficient (with scale factor as needed).
     * With typical images and quantization tables, half or more of the
     * column DCT calculations can be simplified this way.
     */
    
    if (inptr[DCTSIZE*1] == 0 && inptr[DCTSIZE*2] == 0 &&
	inptr[DCTSIZE*3] == 0 && inptr[DCTSIZE*4] == 0 &&
	inptr[DCTSIZE*5] == 0 && inptr[DCTSIZE*6] == 0 &&
	inptr[DCTSIZE*7] == 0) {
      /* AC terms all zero */
      int dcval = (int) DEQUANTIZE(inptr[DCTSIZE*0], quantptr[DCTSIZE*0]);

      wsptr[DCTSIZE*0] = dcval;
      wsptr[DCTSIZE*1] = dcval;
      wsptr[DCTSIZE*2] = dcval;
      wsptr[DCTSIZE*3] = dcval;
      wsptr[DCTSIZE*4] = dcval;
      wsptr[DCTSIZE*5] = dcval;
      wsptr[DCTSIZE*6] = dcval;
      wsptr[DCTSIZE*7] = dcval;
      
      inptr++;			/* advance pointers to next column */
      quantptr++;
      wsptr++;
      continue;
    }
    
    /* Even part */

    tmp0 = DEQUANTIZE(inptr[DCTSIZE*0], quantptr[DCTSIZE*0]);
    tmp1 = DEQUANTIZE(inptr[DCTSIZE*2], quantptr[DCTSIZE*2]);
    tmp2 = DEQUANTIZE(inptr[DCTSIZE*4], quantptr[DCTSIZE*4]);
    tmp3 = DEQUANTIZE(inptr[DCTSIZE*6], quantptr[DCTSIZE*6]);

    tmp10 = tmp0 + tmp2;	/* phase 3 */
    tmp11 = tmp0 - tmp2;

    tmp13 = tmp1 + tmp3;	/* phases 5-3 */
    tmp12 = MULTIPLY(tmp1 - tmp3, FIX_1_414213562) - tmp13; /* 2*c4 */

    tmp0 = tmp10 + tmp13;	/* phase 2 */
    tmp3 = tmp10 - tmp13;
    tmp1 = tmp11 + tmp12;
    tmp2 = tmp11 - tmp12;
    
    /* Odd part */

    tmp4 = DEQUANTIZE(inptr[DCTSIZE*1], quantptr[DCTSIZE*1]);
    tmp5 = DEQUANTIZE(inptr[DCTSIZE*3], quantptr[DCTSIZE*3]);
    tmp6 = DEQUANTIZE(inptr[DCTSIZE*5], quantptr[DCTSIZE*5]);
    tmp7 = DEQUANTIZE(inptr[DCTSIZE*7], quantptr[DCTSIZE*7]);

    z13 = tmp6 + tmp5;		/* phase 6 */
    z10 = tmp6 - tmp5;
    z11 = tmp4 + tmp7;
    z12 = tmp4 - tmp7;

    tmp7 = z11 + z13;		/* phase 5 */
    tmp11 = MULTIPLY(z11 - z13, FIX_1_414213562); /* 2*c4 */

    z5 = MULTIPLY(z10 + z12, FIX_1_847759065); /* 2*c2 */
    tmp10 = MULTIPLY(z12, FIX_1_082392200) - z5; /* 2*(c2-c6) */
    tmp12 = MULTIPLY(z10, - FIX_2_613125930) + z5; /* -2*(c2+c6) */

    tmp6 = tmp12 - tmp7;	/* phase 2 */
    tmp5 = tmp11 - tmp6;
    tmp4 = tmp10 + tmp5;

    wsptr[DCTSIZE*0] = (int) (tmp0 + tmp7);
    wsptr[DCTSIZE*7] = (int) (tmp0 - tmp7);
    wsptr[DCTSIZE*1] = (int) (tmp1 + tmp6);
    wsptr[DCTSIZE*6] = (int) (tmp1 - tmp6);
    wsptr[DCTSIZE*2] = (int) (tmp2 + tmp5);
    wsptr[DCTSIZE*5] = (int) (tmp2 - tmp5);
    wsptr[DCTSIZE*4] = (int) (tmp3 + tmp4);
    wsptr[DCTSIZE*3] = (int) (tmp3 - tmp4);

    inptr++;			/* advance pointers to next column */
    quantptr++;
    wsptr++;
  }
  
  /* Pass 2: process rows from work array, store into output array. */
  /* Note that we must descale the results by a factor of 8 == 2**3, */
  /* and also undo the PASS1_BITS scaling. */

  wsptr = workspace;
  for (ctr = 0; ctr < DCTSIZE; ctr++) {
    outptr = output_buf[ctr] + output_col;
    /* Rows of zeroes can be exploited in the same way as we did with columns.
     * However, the column calculation has created many nonzero AC terms, so
     * the simplification applies less often (typically 5% to 10% of the time).
     * On machines with very fast multiplication, it's possible that the
     * test takes more time than it's worth.  In that case this section
     * may be commented out.
     */
    
#ifndef NO_ZERO_ROW_TEST
    if (wsptr[1] == 0 && wsptr[2] == 0 && wsptr[3] == 0 && wsptr[4] == 0 &&
	wsptr[5] == 0 && wsptr[6] == 0 && wsptr[7] == 0) {
      /* AC terms all zero */
      JSAMPLE dcval = range_limit[IDESCALE(wsptr[0], PASS1_BITS+3)
				  & RANGE_MASK];
      
      outptr[0] = dcval;
      outptr[1] = dcval;
      outptr[2] = dcval;
      outptr[3] = dcval;
      outptr[4] = dcval;
      outptr[5] = dcval;
      outptr[6] = dcval;
      outptr[7] = dcval;

      wsptr += DCTSIZE;		/* advance pointer to next row */
      continue;
    }
#endif
    
    /* Even part */

    tmp10 = ((DCTELEM) wsptr[0] + (DCTELEM) wsptr[4]);
    tmp11 = ((DCTELEM) wsptr[0] - (DCTELEM) wsptr[4]);

    tmp13 = ((DCTELEM) wsptr[2] + (DCTELEM) wsptr[6]);
    tmp12 = MULTIPLY((DCTELEM) wsptr[2] - (DCTELEM) wsptr[6], FIX_1_414213562)
	    - tmp13;

    tmp0 = tmp10 + tmp13;
    tmp3 = tmp10 - tmp13;
    tmp1 = tmp11 + tmp12;
    tmp2 = tmp11 - tmp12;

    /* Odd part */

    z13 = (DCTELEM) wsptr[5] + (DCTELEM) wsptr[3];
    z10 = (DCTELEM) wsptr[5] - (DCTELEM) wsptr[3];
    z11 = (DCTELEM) wsptr[1] + (DCTELEM) wsptr[7];
    z12 = (DCTELEM) wsptr[1] - (DCTELEM) wsptr[7];

    tmp7 = z11 + z13;		/* phase 5 */
    tmp11 = MULTIPLY(z11 - z13, FIX_1_414213562); /* 2*c4 */

    z5 = MULTIPLY(z10 + z12, FIX_1_847759065); /* 2*c2 */
    tmp10 = MULTIPLY(z12, FIX_1_082392200) - z5; /* 2*(c2-c6) */
    tmp12 = MULTIPLY(z10, - FIX_2_613125930) + z5; /* -2*(c2+c6) */

    tmp6 = tmp12 - tmp7;	/* phase 2 */
    tmp5 = tmp11 - tmp6;
    tmp4 = tmp10 + tmp5;

    /* Final output stage: scale down by a factor of 8 and range-limit */

    outptr[0] = range_limit[IDESCALE(tmp0 + tmp7, PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[7] = range_limit[IDESCALE(tmp0 - tmp7, PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[1] = range_limit[IDESCALE(tmp1 + tmp6, PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[6] = range_limit[IDESCALE(tmp1 - tmp6, PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[2] = range_limit[IDESCALE(tmp2 + tmp5, PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[5] = range_limit[IDESCALE(tmp2 - tmp5, PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[4] = range_limit[IDESCALE(tmp3 + tmp4, PASS1_BITS+3)
			    & RANGE_MASK];
    outptr[3] = range_limit[IDESCALE(tmp3 - tmp4, PASS1_BITS+3)
			    & RANGE_MASK];

    wsptr += DCTSIZE;		/* advance pointer to next row */
  }
}